

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderStorageBufferObjectTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::BasicBasicVS::Run(BasicBasicVS *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  long lStack_a0;
  allocator<char> local_8a;
  allocator<char> local_89;
  string local_88;
  float data [12];
  vec3 local_30;
  
  bVar1 = ShaderStorageBufferObjectBase::IsVSFSAvailable
                    (&this->super_ShaderStorageBufferObjectBase,1,0);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)data,
               "\nlayout(std430, binding = 1) buffer InputBuffer {\n  vec4 position[3];\n} g_input_buffer;\nvoid main() {\n  gl_Position = g_input_buffer.position[gl_VertexID];\n}"
               ,&local_89);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,
               "\nlayout(location = 0) out vec4 o_color;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n}"
               ,&local_8a);
    GVar2 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,(string *)data,&local_88);
    this->m_program = GVar2;
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)data);
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    if (bVar1) {
      data[8] = -1.0;
      data[9] = 3.0;
      data[10] = 0.0;
      data[0xb] = 1.0;
      data[4] = 3.0;
      data[5] = -1.0;
      data[6] = 0.0;
      data[7] = 1.0;
      data[0] = -1.0;
      data[1] = -1.0;
      data[2] = 0.0;
      data[3] = 1.0;
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_buffer);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x30,data,0x88e4);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
      glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glClear(this_00,0x4000);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_buffer);
      glu::CallLogWrapper::glDrawArraysInstanced(this_00,4,0,3,1);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,0);
      local_30.m_data[0] = 0.0;
      local_30.m_data[1] = 1.0;
      local_30.m_data[2] = 0.0;
      bVar1 = ShaderStorageBufferObjectBase::CheckFB
                        (&this->super_ShaderStorageBufferObjectBase,&local_30);
      lStack_a0 = (ulong)bVar1 - 1;
    }
    else {
      lStack_a0 = -1;
    }
  }
  else {
    lStack_a0 = 0x10;
  }
  return lStack_a0;
}

Assistant:

virtual long Run()
	{
		if (!IsVSFSAvailable(1, 0))
			return NOT_SUPPORTED;
		const char* const glsl_vs =
			NL "layout(std430, binding = 1) buffer InputBuffer {" NL "  vec4 position[3];" NL "} g_input_buffer;" NL
			   "void main() {" NL "  gl_Position = g_input_buffer.position[gl_VertexID];" NL "}";
		const char* const glsl_fs = NL "layout(location = 0) out vec4 o_color;" NL "void main() {" NL
									   "  o_color = vec4(0.0, 1.0, 0.0, 1.0);" NL "}";
		m_program = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		const float data[12] = { -1.0f, -1.0f, 0.0f, 1.0f, 3.0f, -1.0f, 0.0f, 1.0f, -1.0f, 3.0f, 0.0f, 1.0f };
		glGenBuffers(1, &m_buffer);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);

		glUseProgram(m_program);
		glClear(GL_COLOR_BUFFER_BIT);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_buffer);
		glDrawArraysInstanced(GL_TRIANGLES, 0, 3, 1);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, 0);

		if (!CheckFB(vec3(0, 1, 0)))
			return ERROR;
		else
			return NO_ERROR;
	}